

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pio.c
# Opt level: O0

FILE * fopen_compchk(char *file,int32 *ispipe)

{
  size_t sVar1;
  char *__dest;
  FILE *pFVar2;
  size_t k;
  char *tmpfile;
  FILE *fh;
  int32 *piStack_20;
  int32 isgz;
  int32 *ispipe_local;
  char *file_local;
  
  piStack_20 = ispipe;
  ispipe_local = (int32 *)file;
  file_local = (char *)fopen_comp(file,"r",ispipe);
  if ((FILE *)file_local == (FILE *)0x0) {
    guess_comptype((char *)ispipe_local,piStack_20,(int32 *)((long)&fh + 4));
    sVar1 = strlen((char *)ispipe_local);
    __dest = (char *)__ckd_calloc__(sVar1 + 5,1,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/pio.c"
                                    ,0xde);
    strcpy(__dest,(char *)ispipe_local);
    switch(fh._4_4_) {
    case 0:
      strcpy(__dest + sVar1,".gz");
      pFVar2 = fopen_comp(__dest,"r",piStack_20);
      if (pFVar2 != (FILE *)0x0) {
        err_msg(ERR_WARN,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/pio.c"
                ,0xed,"Using %s instead of %s\n",__dest,ispipe_local);
        ckd_free(__dest);
        return pFVar2;
      }
      strcpy(__dest + sVar1,".bz2");
      pFVar2 = fopen_comp(__dest,"r",piStack_20);
      if (pFVar2 != (FILE *)0x0) {
        err_msg(ERR_WARN,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/pio.c"
                ,0xf3,"Using %s instead of %s\n",__dest,ispipe_local);
        ckd_free(__dest);
        return pFVar2;
      }
      strcpy(__dest + sVar1,".Z");
      pFVar2 = fopen_comp(__dest,"r",piStack_20);
      if (pFVar2 != (FILE *)0x0) {
        err_msg(ERR_WARN,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/pio.c"
                ,0xf9,"Using %s instead of %s\n",__dest,ispipe_local);
        ckd_free(__dest);
        return pFVar2;
      }
      ckd_free(__dest);
      return (FILE *)0x0;
    case 1:
      __dest[sVar1 - 2] = '\0';
      break;
    case 2:
      __dest[sVar1 - 3] = '\0';
      break;
    case 3:
      __dest[sVar1 - 4] = '\0';
    }
    err_msg(ERR_WARN,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/pio.c"
            ,0x100,"Using %s instead of %s\n",__dest,ispipe_local);
    fopen_comp(__dest,"r",piStack_20);
    ckd_free(__dest);
    file_local = (char *)0x0;
  }
  return (FILE *)file_local;
}

Assistant:

FILE *
fopen_compchk(const char *file, int32 * ispipe)
{
#ifndef HAVE_POPEN
    *ispipe = 0; /* No popen() on WinCE */
    /* And therefore the rest of this function is useless. */
    return (fopen_comp(file, "r", ispipe));
#else /* HAVE_POPEN */
    int32 isgz;
    FILE *fh;

    /* First just try to fopen_comp() it */
    if ((fh = fopen_comp(file, "r", ispipe)) != NULL)
        return fh;
    else {
        char *tmpfile;
        size_t k;

        /* File doesn't exist; try other compressed/uncompressed form, as appropriate */
        guess_comptype(file, ispipe, &isgz);
        k = strlen(file);
        tmpfile = ckd_calloc(k+5, 1);
        strcpy(tmpfile, file);
        switch (isgz) {
        case COMP_GZIP:
            tmpfile[k - 3] = '\0';
            break;
        case COMP_BZIP2:
            tmpfile[k - 4] = '\0';
            break;
        case COMP_COMPRESS:
            tmpfile[k - 2] = '\0';
            break;
        case COMP_NONE:
            strcpy(tmpfile + k, ".gz");
            if ((fh = fopen_comp(tmpfile, "r", ispipe)) != NULL) {
                E_WARN("Using %s instead of %s\n", tmpfile, file);
                ckd_free(tmpfile);
                return fh;
            }
            strcpy(tmpfile + k, ".bz2");
            if ((fh = fopen_comp(tmpfile, "r", ispipe)) != NULL) {
                E_WARN("Using %s instead of %s\n", tmpfile, file);
                ckd_free(tmpfile);
                return fh;
            }
            strcpy(tmpfile + k, ".Z");
            if ((fh = fopen_comp(tmpfile, "r", ispipe)) != NULL) {
                E_WARN("Using %s instead of %s\n", tmpfile, file);
                ckd_free(tmpfile);
                return fh;
            }
            ckd_free(tmpfile);
            return NULL;
        }
        E_WARN("Using %s instead of %s\n", tmpfile, file);
        fh = fopen_comp(tmpfile, "r", ispipe);
        ckd_free(tmpfile);
        return NULL;
    }
#endif /* HAVE_POPEN */
}